

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void get_pointer(t_get *x,t_gpointer *gp)

{
  t_template *ptVar1;
  t_pd p_Var2;
  t_gpointer *object;
  int iVar3;
  t_template *ptVar4;
  t_symbol *ptVar5;
  t_symbol *local_58;
  t_symbol *arraytype;
  int type;
  int onset;
  t_getvariable *vp;
  t_word *vec;
  t_gstub *gs;
  t_template *template;
  t_symbol *templatesym;
  int i;
  int nitems;
  t_gpointer *gp_local;
  t_get *x_local;
  
  templatesym._4_4_ = x->x_nout;
  vec = (t_word *)gp->gp_stub;
  _i = gp;
  gp_local = (t_gpointer *)x;
  iVar3 = gpointer_check(gp,0);
  if (iVar3 == 0) {
    pd_error(gp_local,"get: stale or empty pointer");
  }
  else {
    if (*(char *)&(((gp_local[2].gp_un.gp_scalar)->sc_gobj).g_pd)->c_name == '\0') {
      template = (t_template *)gpointer_gettemplatesym(_i);
    }
    else {
      ptVar1 = (t_template *)gp_local[2].gp_un.gp_scalar;
      template = ptVar1;
      ptVar4 = (t_template *)gpointer_gettemplatesym(_i);
      object = gp_local;
      if (ptVar1 != ptVar4) {
        p_Var2 = template->t_pdobj;
        ptVar5 = gpointer_gettemplatesym(_i);
        pd_error(object,"get %s: got wrong template (%s)",p_Var2,ptVar5->s_name);
        return;
      }
    }
    gs = (t_gstub *)template_findbyname((t_symbol *)template);
    if ((t_template *)gs == (t_template *)0x0) {
      pd_error(gp_local,"get: couldn\'t find template %s",template->t_pdobj);
    }
    else {
      if (vec[1].w_index == 2) {
        vp = (t_getvariable *)(_i->gp_un).gp_scalar;
      }
      else {
        vp = (t_getvariable *)((_i->gp_un).gp_scalar)->sc_vec;
      }
      templatesym._0_4_ = templatesym._4_4_ + -1;
      _type = gp_local[2].gp_stub + (int)templatesym;
      for (; -1 < (int)templatesym; templatesym._0_4_ = (int)templatesym + -1) {
        iVar3 = template_find_field((t_template *)gs,(t_symbol *)(_type->gs_un).gs_glist,
                                    (int *)((long)&arraytype + 4),(int *)&arraytype,&local_58);
        if (iVar3 == 0) {
          pd_error(gp_local,"get: %s.%s: no such field",((gs[1].gs_un.gs_glist)->gl_obj).te_g.g_pd,
                   (((_type->gs_un).gs_glist)->gl_obj).te_g.g_pd);
        }
        else if ((int)arraytype == 0) {
          outlet_float(*(_outlet **)&_type->gs_which,
                       *(t_float *)((long)&vp->gv_sym + (long)arraytype._4_4_));
        }
        else if ((int)arraytype == 1) {
          outlet_symbol(*(_outlet **)&_type->gs_which,
                        *(t_symbol **)((long)&vp->gv_sym + (long)arraytype._4_4_));
        }
        else {
          pd_error(gp_local,"get: %s.%s is not a number or symbol",
                   ((gs[1].gs_un.gs_glist)->gl_obj).te_g.g_pd,
                   (((_type->gs_un).gs_glist)->gl_obj).te_g.g_pd);
        }
        _type = _type + -1;
      }
    }
  }
  return;
}

Assistant:

static void get_pointer(t_get *x, t_gpointer *gp)
{
    int nitems = x->x_nout, i;
    t_symbol *templatesym;
    t_template *template;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    t_getvariable *vp;

    if (!gpointer_check(gp, 0))
    {
        pd_error(x, "get: stale or empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) != gpointer_gettemplatesym(gp))
        {
            pd_error(x, "get %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "get: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (gs->gs_which == GP_ARRAY) vec = gp->gp_un.gp_w;
    else vec = gp->gp_un.gp_scalar->sc_vec;
    for (i = nitems - 1, vp = x->x_variables + i; i >= 0; i--, vp--)
    {
        int onset, type;
        t_symbol *arraytype;
        if (template_find_field(template, vp->gv_sym, &onset, &type, &arraytype))
        {
            if (type == DT_FLOAT)
                outlet_float(vp->gv_outlet,
                    *(t_float *)(((char *)vec) + onset));
            else if (type == DT_SYMBOL)
                outlet_symbol(vp->gv_outlet,
                    *(t_symbol **)(((char *)vec) + onset));
            else pd_error(x, "get: %s.%s is not a number or symbol",
                    template->t_sym->s_name, vp->gv_sym->s_name);
        }
        else pd_error(x, "get: %s.%s: no such field",
            template->t_sym->s_name, vp->gv_sym->s_name);
    }
}